

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O2

UINT8 Pulse_SetCallback(void *drvObj,AUDFUNC_FILLBUF FillBufCallback,void *userParam)

{
  *(byte *)((long)drvObj + 0x50) = *(byte *)((long)drvObj + 0x50) | 2;
  OSMutex_Lock(*(OS_MUTEX **)((long)drvObj + 0x40));
  *(void **)((long)drvObj + 0x60) = userParam;
  *(AUDFUNC_FILLBUF *)((long)drvObj + 0x68) = FillBufCallback;
  *(byte *)((long)drvObj + 0x50) = *(byte *)((long)drvObj + 0x50) & 0xfd;
  OSMutex_Unlock(*(OS_MUTEX **)((long)drvObj + 0x40));
  return '\0';
}

Assistant:

UINT8 Pulse_SetCallback(void* drvObj, AUDFUNC_FILLBUF FillBufCallback, void* userParam)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	
	drv->pauseThread |= 0x02;
	OSMutex_Lock(drv->hMutex);
	drv->userParam = userParam;
	drv->FillBuffer = FillBufCallback;
	drv->pauseThread &= ~0x02;
	OSMutex_Unlock(drv->hMutex);
	
	return AERR_OK;
}